

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<pbrt::BSDFSample> * __thiscall
pstd::optional<pbrt::BSDFSample>::operator=
          (optional<pbrt::BSDFSample> *this,optional<pbrt::BSDFSample> *v)

{
  bool bVar1;
  optional<pbrt::BSDFSample> *this_00;
  BSDFSample *__src;
  optional<pbrt::BSDFSample> *in_RSI;
  optional<pbrt::BSDFSample> *in_RDI;
  optional<pbrt::BSDFSample> *in_stack_ffffffffffffffe0;
  
  reset(in_stack_ffffffffffffffe0);
  bVar1 = has_value(in_RSI);
  if (bVar1) {
    this_00 = (optional<pbrt::BSDFSample> *)ptr((optional<pbrt::BSDFSample> *)0x88e3e7);
    __src = value(this_00);
    memcpy(this_00,__src,0x2c);
    in_RDI->set = true;
    reset(this_00);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }